

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

bool validate_throws(t_struct *throws)

{
  bool bVar1;
  uint uVar2;
  reference pptVar3;
  t_type *ptVar4;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_38;
  t_field **local_30;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_28;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  t_struct *throws_local;
  
  m_iter._M_current = (t_field **)t_struct::get_members(throws);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&local_28);
  local_30 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  local_28._M_current = local_30;
  while( true ) {
    local_38._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_38);
    if (!bVar1) {
      return true;
    }
    pptVar3 = __gnu_cxx::
              __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
              ::operator*(&local_28);
    ptVar4 = t_field::get_type(*pptVar3);
    ptVar4 = t_generator::get_true_type(ptVar4);
    uVar2 = (*(ptVar4->super_t_doc)._vptr_t_doc[0xc])();
    if ((uVar2 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&local_28);
  }
  return false;
}

Assistant:

bool validate_throws(t_struct *throws) {
    const vector<t_field *> &members = throws->get_members();
    vector<t_field *>::const_iterator m_iter;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
        if (!t_generator::get_true_type((*m_iter)->get_type())->is_xception()) {
            return false;
        }
    }
    return true;
}